

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionCodeGenRuntimeData.cpp
# Opt level: O0

FunctionCodeGenRuntimeData * __thiscall
Js::FunctionCodeGenRuntimeData::GetForTarget
          (FunctionCodeGenRuntimeData *this,FunctionBody *targetFuncBody)

{
  code *pcVar1;
  FunctionBody *pFVar2;
  FunctionCodeGenRuntimeData **ppFVar3;
  undefined4 *puVar4;
  bool bVar5;
  FunctionCodeGenRuntimeData *local_20;
  FunctionCodeGenRuntimeData *target;
  FunctionBody *targetFuncBody_local;
  FunctionCodeGenRuntimeData *this_local;
  
  local_20 = this;
  while( true ) {
    bVar5 = false;
    if (local_20 != (FunctionCodeGenRuntimeData *)0x0) {
      pFVar2 = GetFunctionBody(local_20);
      bVar5 = pFVar2 != targetFuncBody;
    }
    if (!bVar5) break;
    ppFVar3 = Memory::WriteBarrierPtr::operator_cast_to_FunctionCodeGenRuntimeData__
                        ((WriteBarrierPtr *)&local_20->next);
    local_20 = *ppFVar3;
  }
  if (local_20 == (FunctionCodeGenRuntimeData *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/FunctionCodeGenRuntimeData.cpp"
                                ,0x26,"(target)","target");
    if (!bVar5) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  return local_20;
}

Assistant:

const FunctionCodeGenRuntimeData * FunctionCodeGenRuntimeData::GetForTarget(FunctionBody *targetFuncBody) const
    {
        const FunctionCodeGenRuntimeData * target = this;
        while (target && target->GetFunctionBody() != targetFuncBody)
        {
            target = target->next;
        }
        // we should always find the info
        Assert(target);
        return target;
    }